

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
HPresolve::getBoundOnLByZj
          (HPresolve *this,int row,int j,double *lo,double *up,double colLow,double colUpp)

{
  reference pvVar1;
  reference pvVar2;
  double *in_RCX;
  int __x;
  long in_RDI;
  double *in_R8;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  vector<double,_std::allocator<double>_> *in_XMM1_Qa;
  double aij;
  int kk;
  double sum;
  double x;
  double cost;
  size_type in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff88;
  HPreData *in_stack_ffffffffffffff90;
  int local_4c;
  double local_48;
  
  pvVar1 = std::vector<double,_std::allocator<double>_>::at
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  dVar4 = *pvVar1;
  local_48 = 0.0;
  pvVar2 = std::vector<int,_std::allocator<int>_>::at
                     ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                      in_stack_ffffffffffffff68);
  for (local_4c = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::at
                         ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68), local_4c < *pvVar2; local_4c = local_4c + 1) {
    in_stack_ffffffffffffff90 = (HPreData *)(in_RDI + 0x240);
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff68);
    if (*pvVar2 != 0) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      dVar3 = *pvVar1;
      std::vector<int,_std::allocator<int>_>::at
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff68);
      pvVar1 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff88 = local_48;
      local_48 = dVar3 * *pvVar1 + local_48;
    }
  }
  __x = (int)in_RDI;
  dVar3 = HPreData::getaij(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                           ,SUB84(in_stack_ffffffffffffff88,0));
  dVar4 = (-dVar4 - local_48) / dVar3;
  std::abs(__x);
  if (*(double *)(in_RDI + 0xae8) <= extraout_XMM0_Qa) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if ((*pvVar1 - in_XMM0_Qa < *(double *)(in_RDI + 0xae8) ||
         *pvVar1 - in_XMM0_Qa == *(double *)(in_RDI + 0xae8)) ||
       (in_stack_ffffffffffffff70 = in_XMM1_Qa,
       pvVar1 = std::vector<double,_std::allocator<double>_>::at
                          (in_XMM1_Qa,in_stack_ffffffffffffff68),
       (double)in_stack_ffffffffffffff70 - *pvVar1 < *(double *)(in_RDI + 0xae8) ||
       (double)in_stack_ffffffffffffff70 - *pvVar1 == *(double *)(in_RDI + 0xae8))) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if ((*pvVar1 != in_XMM0_Qa) || ((NAN(*pvVar1) || NAN(in_XMM0_Qa) || (0.0 <= dVar3)))) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::at
                           (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if ((*pvVar1 != (double)in_XMM1_Qa) ||
           ((NAN(*pvVar1) || NAN((double)in_XMM1_Qa) || (dVar3 <= 0.0)))) {
          pvVar1 = std::vector<double,_std::allocator<double>_>::at
                             (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          if ((*pvVar1 != in_XMM0_Qa) || ((NAN(*pvVar1) || NAN(in_XMM0_Qa) || (dVar3 <= 0.0)))) {
            pvVar1 = std::vector<double,_std::allocator<double>_>::at
                               (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            if (*pvVar1 != (double)in_XMM1_Qa) {
              return;
            }
            if (NAN(*pvVar1) || NAN((double)in_XMM1_Qa)) {
              return;
            }
            if (0.0 <= dVar3) {
              return;
            }
          }
          if (dVar4 < *in_RCX || dVar4 == *in_RCX) {
            return;
          }
          *in_RCX = dVar4;
          return;
        }
      }
      if (dVar4 < *in_R8) {
        *in_R8 = dVar4;
      }
    }
    else {
      if (dVar4 < *in_R8) {
        *in_R8 = dVar4;
      }
      if (*in_RCX <= dVar4 && dVar4 != *in_RCX) {
        *in_RCX = dVar4;
      }
    }
  }
  return;
}

Assistant:

void HPresolve::getBoundOnLByZj(int row, int j, double* lo, double* up, double colLow, double colUpp) {

	double cost = colCostAtEl.at(j);//valueColDual.at(j);
	double x = -cost;

	double sum = 0;
	for (int kk=Astart.at(j); kk<Aend.at(j);++kk)
		if (flagRow.at(Aindex.at(kk))) {
			sum = sum + Avalue.at(kk)*valueRowDual.at(Aindex.at(kk));
		}
	x = x - sum;

	double aij=getaij(row,j);
	x = x/aij;


	if (abs(colLow-colUpp) < tol)
		return; //here there is no restriction on zj so no bound on y

	if ((valuePrimal.at(j) - colLow) > tol && (colUpp - valuePrimal.at(j)) > tol) {
		//set both bounds
		if (x<*up)
			*up = x;
		if (x>*lo)
			*lo = x;
	}

	else if ((valuePrimal.at(j) == colLow && aij<0) || (valuePrimal.at(j) == colUpp && aij>0)) {
		if (x<*up)
			*up = x;
	}
	else if ((valuePrimal.at(j) == colLow && aij>0) || (valuePrimal.at(j) == colUpp && aij<0)) {
		if (x>*lo)
			*lo = x;
	}
}